

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode
JsSetHostPromiseRejectionTracker
          (JsHostPromiseRejectionTrackerCallback promiseRejectionTrackerCallback,void *callbackState
          )

{
  anon_class_16_2_7c6d7cc6 fn;
  JsErrorCode JVar1;
  void *local_18;
  void *callbackState_local;
  JsHostPromiseRejectionTrackerCallback promiseRejectionTrackerCallback_local;
  
  fn.callbackState = &local_18;
  fn.promiseRejectionTrackerCallback = (JsHostPromiseRejectionTrackerCallback *)&callbackState_local
  ;
  local_18 = callbackState;
  callbackState_local = promiseRejectionTrackerCallback;
  JVar1 = ContextAPINoScriptWrapper_NoRecord<JsSetHostPromiseRejectionTracker::__0>(fn,true,false);
  return JVar1;
}

Assistant:

END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsSetHostPromiseRejectionTracker(_In_ JsHostPromiseRejectionTrackerCallback promiseRejectionTrackerCallback, _In_opt_ void *callbackState)
{
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        scriptContext->GetLibrary()->SetNativeHostPromiseRejectionTrackerCallback((Js::JavascriptLibrary::HostPromiseRejectionTrackerCallback) promiseRejectionTrackerCallback, callbackState);
        return JsNoError;
    },
        /*allowInObjectBeforeCollectCallback*/true);
}